

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_influence.h
# Opt level: O1

void __thiscall
xray_re::_influence<unsigned_int,_float>::set
          (_influence<unsigned_int,_float> *this,size_t num_bones,uint16_t *bones,float *weights)

{
  uint *puVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  
  if (num_bones != 0) {
    fVar7 = 0.0;
    do {
      num_bones = num_bones - 1;
      if (num_bones == 0) {
        fVar8 = 1.0 - fVar7;
      }
      else {
        fVar8 = *weights;
        weights = weights + 1;
        fVar7 = fVar7 + fVar8;
      }
      uVar2 = *bones;
      uVar3 = (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count;
      uVar4 = (ulong)uVar3;
      bVar6 = uVar4 == 0;
      if (bVar6) {
LAB_0016286a:
        if (3 < uVar3) {
          __assert_fail("count < N",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_fixed_vector.h"
                        ,0x5b,
                        "void xray_re::_svector<xray_re::_bone_weight<unsigned int, float>, 4>::push_back(const T &) [T = xray_re::_bone_weight<unsigned int, float>, N = 4]"
                       );
        }
        (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count = uVar3 + 1;
        (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[uVar4].bone =
             (uint)uVar2;
        (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[uVar4].weight =
             fVar8;
      }
      else {
        if ((this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[0].bone !=
            (uint)uVar2) {
          lVar5 = 8;
          do {
            bVar6 = uVar4 * 8 - lVar5 == 0;
            if (bVar6) goto LAB_0016286a;
            puVar1 = (uint *)((long)&(this->
                                     super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>)
                                     .array[0].bone + lVar5);
            lVar5 = lVar5 + 8;
          } while (*puVar1 != (uint)uVar2);
        }
        if (bVar6) goto LAB_0016286a;
      }
      bones = bones + 1;
    } while (num_bones != 0);
  }
  reorder(this);
  return;
}

Assistant:

void _influence<Tb, Tw>::set(size_t num_bones, const uint16_t* bones, const float* weights)
{
	for (float sum = 0, w; num_bones;) {
		if (--num_bones == 0) {
			w = 1.f - sum;
		} else {
			w = *weights++;
			sum += w;
		}
		_bone_weight<Tb, Tw> bw(*bones++, w);
		for (typename _influence<Tb, Tw>::iterator it = _influence<Tb, Tw>::begin(),
				last = _influence<Tb, Tw>::end(); it != last; ++it) {
			if (it->bone == bw.bone) {
#if 0
				if (!equivalent<Tw>(w, 0)) {
					msg("bone%u, w=%f", bw.bone, w);
				}
				xr_assert(equivalent<Tw>(w, 0));
#endif
				goto skip;
			}
		}
		push_back(bw);
skip:;
	}
	reorder();
}